

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.h
# Opt level: O1

void __thiscall sfc::Subpalette::~Subpalette(Subpalette *this)

{
  pointer puVar1;
  
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->_colors_set)._M_t);
  puVar1 = (this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->_colors).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

Subpalette(Mode mode, unsigned max_colors) : _mode(mode), _max_colors(max_colors){}